

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QGraphicsItem::installSceneEventFilter(QGraphicsItem *this,QGraphicsItem *filterItem)

{
  QGraphicsItemPrivate *pQVar1;
  QGraphicsScenePrivate *pQVar2;
  QGraphicsItem *in_RSI;
  QGraphicsItem *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffff98;
  QGraphicsScenePrivate *this_00;
  QGraphicsItem *this_01;
  char local_48 [32];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->(&in_RDI->d_ptr);
  if (pQVar1->scene == (QGraphicsScene *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_01,(char *)in_RSI,(int)((ulong)in_RDI >> 0x20),
               in_stack_ffffffffffffff98);
    QMessageLogger::warning
              (local_28,
               "QGraphicsItem::installSceneEventFilter: event filters can only be installed on items in a scene."
              );
  }
  else {
    pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&in_RDI->d_ptr);
    this_00 = (QGraphicsScenePrivate *)pQVar1->scene;
    pQVar2 = (QGraphicsScenePrivate *)scene((QGraphicsItem *)0x98491b);
    if (this_00 == pQVar2) {
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                (&in_RDI->d_ptr);
      QGraphicsScene::d_func((QGraphicsScene *)0x984969);
      QGraphicsScenePrivate::installSceneEventFilter(this_00,in_RSI,in_RDI);
    }
    else {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_01,(char *)in_RSI,(int)((ulong)in_RDI >> 0x20),
                 (char *)this_00);
      QMessageLogger::warning
                (local_48,
                 "QGraphicsItem::installSceneEventFilter: event filters can only be installed on items in the same scene."
                );
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::installSceneEventFilter(QGraphicsItem *filterItem)
{
    if (!d_ptr->scene) {
        qWarning("QGraphicsItem::installSceneEventFilter: event filters can only be installed"
                 " on items in a scene.");
        return;
    }
    if (d_ptr->scene != filterItem->scene()) {
        qWarning("QGraphicsItem::installSceneEventFilter: event filters can only be installed"
                 " on items in the same scene.");
        return;
    }
    d_ptr->scene->d_func()->installSceneEventFilter(this, filterItem);
}